

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPrintVisitor.cpp
# Opt level: O2

string * __thiscall
CPrintVisitor::ConstructLabel
          (string *__return_storage_ptr__,CPrintVisitor *this,string *label,int id)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  std::__cxx11::to_string(&local_38,id);
  std::operator+(&bStack_98,"\t",&local_38);
  std::operator+(&local_78,&bStack_98,"[label=\"");
  std::operator+(&local_58,&local_78,label);
  std::operator+(__return_storage_ptr__,&local_58,"\"]\n");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&bStack_98);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string CPrintVisitor::ConstructLabel(std::string label, int id) {
	return "\t" + std::to_string(id) + "[label=\"" + label + "\"]\n";
}